

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_asm.c
# Opt level: O0

void emit_asm_label(BuildCtx *ctx,char *name,int size,int isfunc)

{
  BuildMode BVar1;
  char *pcVar2;
  int isfunc_local;
  int size_local;
  char *name_local;
  BuildCtx *ctx_local;
  
  BVar1 = ctx->mode;
  if (BVar1 == BUILD_elfasm) {
    pcVar2 = "object";
    if (isfunc != 0) {
      pcVar2 = "function";
    }
    fprintf((FILE *)ctx->fp,"\n\t.globl %s\n\t.hidden %s\n\t.type %s, @%s\n\t.size %s, %d\n%s:\n",
            name,name,name,pcVar2,name,size,name);
  }
  else if (BVar1 == BUILD_coffasm) {
    fprintf((FILE *)ctx->fp,"\n\t.globl %s\n",name);
    if (isfunc != 0) {
      fprintf((FILE *)ctx->fp,"\t.def %s; .scl 3; .type 32; .endef\n",name);
    }
    fprintf((FILE *)ctx->fp,"%s:\n",name);
  }
  else if (BVar1 == BUILD_machasm) {
    fprintf((FILE *)ctx->fp,"\n\t.private_extern %s\n\t.no_dead_strip %s\n%s:\n",name,name,name);
  }
  return;
}

Assistant:

static void emit_asm_label(BuildCtx *ctx, const char *name, int size, int isfunc)
{
  switch (ctx->mode) {
  case BUILD_elfasm:
#if LJ_TARGET_PS3
    if (!strncmp(name, "lj_vm_", 6) &&
	strcmp(name, ctx->beginsym) &&
	!strstr(name, "hook")) {
      fprintf(ctx->fp,
	"\n\t.globl %s\n"
	"\t.section \".opd\",\"aw\"\n"
	"%s:\n"
	"\t.long .%s,.TOC.@tocbase32\n"
	"\t.size %s,8\n"
	"\t.previous\n"
	"\t.globl .%s\n"
	"\t.hidden .%s\n"
	"\t.type .%s, " ELFASM_PX "function\n"
	"\t.size .%s, %d\n"
	".%s:\n",
	name, name, name, name, name, name, name, name, size, name);
      break;
    }
#endif
    fprintf(ctx->fp,
      "\n\t.globl %s\n"
      "\t.hidden %s\n"
      "\t.type %s, " ELFASM_PX "%s\n"
      "\t.size %s, %d\n"
      "%s:\n",
      name, name, name, isfunc ? "function" : "object", name, size, name);
    break;
  case BUILD_coffasm:
    fprintf(ctx->fp, "\n\t.globl %s\n", name);
    if (isfunc)
      fprintf(ctx->fp, "\t.def %s; .scl 3; .type 32; .endef\n", name);
    fprintf(ctx->fp, "%s:\n", name);
    break;
  case BUILD_machasm:
    fprintf(ctx->fp,
      "\n\t.private_extern %s\n"
      "\t.no_dead_strip %s\n"
      "%s:\n", name, name, name);
    break;
  default:
    break;
  }
}